

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution_x86::forward(Deconvolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  long in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  bool bVar5;
  float fVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float w_2;
  int k;
  float val;
  int sx;
  int sxs;
  int x;
  float *sptr;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  float sum;
  int j;
  int i;
  int outh_1;
  int outw_1;
  int channels;
  int h_1;
  int w_1;
  float *outptr;
  int p;
  int maxk;
  Mat top_blob_bordered;
  size_t out_elemsize;
  int out_elempack;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  size_t elemsize;
  int h;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  int in_stack_00001e70;
  int in_stack_00001e78;
  int in_stack_00001e80;
  int in_stack_00001e88;
  int in_stack_00001e90;
  Mat *in_stack_00001e98;
  Option *in_stack_00001ea0;
  int in_stack_00002150;
  int in_stack_00002158;
  int in_stack_00002160;
  int in_stack_00002168;
  int in_stack_00002170;
  Mat *in_stack_00002178;
  Option *in_stack_00002180;
  int in_stack_fffffffffffff924;
  undefined4 in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff92c;
  undefined8 in_stack_fffffffffffff930;
  int iVar10;
  undefined8 in_stack_fffffffffffff938;
  int iVar11;
  Mat *in_stack_fffffffffffff940;
  Mat *in_stack_fffffffffffff948;
  undefined8 *puVar12;
  undefined7 in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff957;
  Deconvolution *in_stack_fffffffffffff958;
  float local_694;
  Allocator *in_stack_fffffffffffff9a0;
  bool local_5dd;
  int local_59c;
  int local_584;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined4 local_568;
  long local_560;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 local_548;
  undefined8 local_540;
  int local_534;
  undefined8 local_530;
  undefined8 local_528;
  undefined8 local_520;
  undefined4 local_518;
  long local_510;
  undefined4 local_508;
  undefined4 local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined8 local_4f0;
  long local_4e8;
  float local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  undefined8 local_4c0;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  undefined8 uVar13;
  Mat *in_stack_fffffffffffffb50;
  Mat *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  Mat *top_blob_00;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  Mat *in_stack_fffffffffffffb70;
  undefined4 uVar14;
  Mat *in_stack_fffffffffffffb78;
  Mat *in_stack_fffffffffffffb80;
  void *local_478;
  int local_470;
  undefined1 local_458 [32];
  long *local_438;
  undefined4 local_430;
  int local_42c;
  int local_428;
  undefined4 local_424;
  int local_420;
  long local_418;
  long local_410;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  ulong local_3f0;
  int local_3e8;
  int local_3e4;
  long *local_3d8;
  long *local_3d0;
  int local_3bc;
  undefined1 *local_3b8;
  undefined8 *local_3b0;
  undefined1 local_3a5;
  int local_3a4;
  undefined1 *local_3a0;
  undefined8 *local_398;
  undefined8 in_stack_fffffffffffffc70;
  Mat *in_stack_fffffffffffffc78;
  Mat *in_stack_fffffffffffffc80;
  Mat *in_stack_fffffffffffffc88;
  Mat *in_stack_fffffffffffffc90;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  long *local_1c8;
  undefined4 local_1c0;
  float local_1bc [3];
  long *local_1b0;
  undefined8 local_1a8;
  long *local_1a0;
  undefined8 local_198;
  long *local_190;
  undefined8 local_188;
  long *local_180;
  undefined8 local_178;
  long *local_170;
  long local_168;
  undefined4 local_15c;
  long local_158;
  long local_150;
  undefined4 local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  long local_130;
  undefined4 local_124;
  long local_120;
  long local_118;
  undefined4 local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  long *local_f8;
  int local_ec;
  Allocator *local_e8;
  void *local_e0;
  bool local_d4;
  bool bStack_d3;
  bool bStack_d2;
  bool bStack_d1;
  undefined8 *local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  Mat *in_stack_ffffffffffffffc8;
  Option *in_stack_ffffffffffffffd0;
  undefined8 extraout_XMM0_Qb;
  
  iVar10 = (int)((ulong)in_stack_fffffffffffff930 >> 0x20);
  top_blob_00 = (Mat *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60);
  uVar13 = CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48);
  local_3e4 = *(int *)((long)in_RSI + 0x2c);
  local_3e8 = (int)in_RSI[6];
  local_3f0 = in_RSI[2];
  local_3f4 = (int)in_RSI[3];
  local_3f8 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) *
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) + -1) + 1;
  local_3fc = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) *
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) + -1) + 1;
  local_400 = (local_3e4 + -1) * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) +
              local_3f8 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc);
  local_404 = (local_3e8 + -1) * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
              local_3fc + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100);
  local_408 = 1;
  if (((*(byte *)(in_RCX + 0x27) & 1) != 0) &&
     (local_408 = 1, *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0)) {
    local_408 = 4;
  }
  local_410 = (local_3f0 / (ulong)(long)local_3f4) * (long)local_408;
  local_3b8 = local_458;
  local_458._0_8_ = (void *)0x0;
  local_458._8_8_ = (Allocator *)0x0;
  local_458._16_8_ = (Allocator *)0x0;
  local_458._24_4_ = 0;
  local_438 = (long *)0x0;
  local_430._0_1_ = false;
  local_430._1_1_ = false;
  local_430._2_1_ = false;
  local_430._3_1_ = false;
  local_42c = 0;
  local_428 = 0;
  local_424._0_1_ = false;
  local_424._1_1_ = false;
  local_424._2_1_ = false;
  local_424._3_1_ = false;
  local_420 = 0;
  local_418 = 0;
  iVar11 = (int)((ulong)in_stack_fffffffffffff938 >> 0x20);
  local_3d8 = in_RDX;
  local_3d0 = in_RSI;
  if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) < 1) &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) < 1)) &&
      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4) < 1)) &&
     ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) < 1 &&
      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) < 1 ||
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) < 1)))))) {
    if ((long *)local_458 != in_RDX) {
      if (in_RDX[1] != 0) {
        LOCK();
        *(int *)in_RDX[1] = *(int *)in_RDX[1] + 1;
        UNLOCK();
      }
      local_458._0_8_ = *in_RDX;
      local_458._8_8_ = in_RDX[1];
      local_458._16_8_ = in_RDX[2];
      local_458._24_4_ = (undefined4)in_RDX[3];
      local_438 = (long *)in_RDX[4];
      local_430 = *(undefined4 *)(in_RDX + 5);
      local_42c = *(int *)((long)in_RDX + 0x2c);
      local_428 = (int)in_RDX[6];
      local_424 = *(undefined4 *)((long)in_RDX + 0x34);
      local_420 = (int)in_RDX[7];
      local_418 = in_RDX[8];
    }
    Mat::create(in_stack_fffffffffffff940,iVar11,(int)in_stack_fffffffffffff938,iVar10,
                CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                in_stack_fffffffffffff924,in_stack_fffffffffffff9a0);
  }
  else {
    Mat::create(in_stack_fffffffffffff940,iVar11,(int)in_stack_fffffffffffff938,iVar10,
                CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                in_stack_fffffffffffff924,in_stack_fffffffffffff9a0);
  }
  if ((void *)local_458._0_8_ != (void *)0x0) {
    in_stack_ffffffffffffffd0 = (Option *)local_458;
  }
  local_5dd = (void *)local_458._0_8_ != (void *)0x0 && local_418 * local_420 != 0;
  if (local_5dd) {
    iVar10 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    iVar11 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    if ((local_3f4 == 4) && (local_408 == 4)) {
      deconvolution_pack4_sse
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                 in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                 (int)in_stack_fffffffffffffc70,in_stack_00002150,in_stack_00002158,
                 in_stack_00002160,in_stack_00002168,in_stack_00002170,in_stack_00002178,
                 in_stack_00002180);
    }
    if ((local_3f4 == 1) && (local_408 == 4)) {
      deconvolution_pack1to4_sse
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                 (Mat *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                 (int)((ulong)top_blob_00 >> 0x20),(int)top_blob_00,in_stack_00001e70,
                 in_stack_00001e78,in_stack_00001e80,in_stack_00001e88,in_stack_00001e90,
                 in_stack_00001e98,in_stack_00001ea0);
    }
    if ((local_3f4 == 4) && (local_408 == 1)) {
      deconvolution_pack4to1_sse
                ((Mat *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),top_blob_00,
                 in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,(int)((ulong)uVar13 >> 0x20),
                 (int)uVar13,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
    }
    if ((local_3f4 == 1) && (local_408 == 1)) {
      for (local_470 = 0; local_470 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
          local_470 = local_470 + 1) {
        local_398 = &local_4c0;
        local_3a0 = local_458;
        local_478 = (void *)(local_458._0_8_ + local_418 * local_470 * local_458._16_8_);
        local_c8 = &local_4c0;
        uVar14 = 1;
        local_b8 = (long)local_42c * (long)(int)in_stack_fffffffffffffb70 * local_458._16_8_;
        local_3b0 = &local_4c0;
        local_bc = 0x10;
        local_d4 = local_424._0_1_;
        bStack_d3 = local_424._1_1_;
        bStack_d2 = local_424._2_1_;
        bStack_d1 = local_424._3_1_;
        local_e8 = (Allocator *)local_458._16_8_;
        local_ec = local_458._24_4_;
        local_f8 = local_438;
        local_3a4 = local_470;
        local_3a5 = 1;
        local_4c0 = 0;
        uVar14 = 0;
        local_4c4 = *(int *)((long)local_3d0 + 0x2c);
        local_4c8 = (int)local_3d0[6];
        local_4cc = (int)local_3d0[7];
        local_4d0 = local_42c;
        local_4d4 = local_428;
        local_e0 = local_478;
        for (local_4d8 = 0; local_4d8 < local_4d4; local_4d8 = local_4d8 + 1) {
          for (local_4dc = 0; local_4dc < local_4d0; local_4dc = local_4dc + 1) {
            local_4e0 = 0.0;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c) != 0) {
              local_4e0 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1a8) +
                                    (long)local_470 * 4);
            }
            local_13c = *(int *)((long)in_RDI + 0x34);
            local_140 = (int)in_RDI[7];
            local_144 = *(undefined4 *)((long)in_RDI + 0x3c);
            local_150 = in_RDI[1] + in_RDI[9] * (long)local_470 * in_RDI[3];
            local_158 = in_RDI[3];
            local_15c = (undefined4)in_RDI[4];
            local_168 = in_RDI[5];
            local_138 = &local_530;
            local_98 = (long)local_13c * (long)local_140 * local_158;
            local_9c = 0x10;
            local_530 = 0;
            local_520 = 0;
            local_518 = 0;
            local_508 = 0;
            local_504 = 0;
            local_500 = 0;
            local_4fc = 0;
            local_4f8 = 0;
            local_4f0 = 0;
            local_528 = 0;
            local_4e8 = local_150;
            for (local_534 = 0; fVar1 = local_4e0, local_534 < local_4cc; local_534 = local_534 + 1)
            {
              local_104 = *(int *)((long)local_3d0 + 0x2c);
              local_108 = (int)local_3d0[6];
              local_10c = *(undefined4 *)((long)local_3d0 + 0x34);
              local_118 = *local_3d0 + local_3d0[8] * (long)local_534 * local_3d0[2];
              local_120 = local_3d0[2];
              local_124 = (undefined4)local_3d0[3];
              local_130 = local_3d0[4];
              local_100 = &local_580;
              local_a8 = (long)local_104 * (long)local_108 * local_120;
              local_ac = 0x10;
              for (local_584 = 0;
                  local_584 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
                  local_584 = local_584 + 1) {
                iVar2 = (local_4d8 +
                        local_584 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0)) -
                        (local_3fc + -1);
                if (((-1 < iVar2) &&
                    (iVar2 % *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 0)) &&
                   (iVar2 = iVar2 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8),
                   iVar2 < local_4c8)) {
                  for (local_59c = 0;
                      local_59c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                      local_59c = local_59c + 1) {
                    iVar3 = (local_4dc +
                            local_59c * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc))
                            - (local_3f8 + -1);
                    if (((-1 < iVar3) &&
                        (iVar3 % *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0))
                       && (iVar3 = iVar3 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4
                                                   ), iVar3 < local_4c4)) {
                      local_4e0 = *(float *)(local_118 + (long)local_104 * (long)iVar2 * local_120 +
                                            (long)iVar3 * 4) *
                                  *(float *)(local_4e8 +
                                            (long)(local_584 *
                                                   *(int *)((long)in_RDI +
                                                           *(long *)(*in_RDI + -0x18) + 0xd4) +
                                                  local_59c) * 4) + local_4e0;
                    }
                  }
                }
              }
              local_4e8 = local_4e8 + (long)(iVar10 * iVar11) * 4;
              local_580 = 0;
              local_570 = 0;
              local_568 = 0;
              local_558 = 0;
              local_554 = 0;
              local_550 = 0;
              local_54c = 0;
              local_548 = 0;
              local_540 = 0;
              local_578 = 0;
              local_560 = local_130;
            }
            local_1c0 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114);
            local_1c8 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118);
            local_1bc[0] = local_4e0;
            local_510 = local_168;
            switch(local_1c0) {
            case 1:
              dVar7 = std::fmax((double)(ulong)(uint)local_4e0,0.0);
              local_1bc[0] = SUB84(dVar7,0);
              break;
            case 2:
              local_178 = 0;
              local_1cc = *(float *)*local_1c8;
              if (local_4e0 <= 0.0) {
                local_694 = local_4e0 * local_1cc;
              }
              else {
                local_694 = local_4e0;
              }
              local_1bc[0] = local_694;
              local_170 = local_1c8;
              break;
            case 3:
              local_188 = 0;
              local_1d0 = *(float *)*local_1c8;
              local_198 = 1;
              local_1d4 = *(float *)(*local_1c8 + 4);
              if (local_4e0 < local_1d0) {
                local_1bc[0] = local_1d0;
              }
              local_190 = local_1c8;
              local_180 = local_1c8;
              if (local_1d4 < local_1bc[0]) {
                local_1bc[0] = local_1d4;
              }
              break;
            case 4:
              local_1d8 = 88.37626;
              pfVar4 = std::min<float>(local_1bc,&local_1d8);
              local_1bc[0] = *pfVar4;
              local_1dc = -88.37626;
              pfVar4 = std::max<float>(local_1bc,&local_1dc);
              local_1bc[0] = *pfVar4;
              dVar7 = std::exp((double)(ulong)(uint)-local_1bc[0]);
              local_1bc[0] = 1.0 / (SUB84(dVar7,0) + 1.0);
              break;
            case 5:
              auVar8._0_8_ = std::exp((double)(ulong)(uint)local_4e0);
              auVar8._8_8_ = extraout_XMM0_Qb;
              auVar9._4_12_ = auVar8._4_12_;
              auVar9._0_4_ = SUB84(auVar8._0_8_,0) + 1.0;
              dVar7 = std::log(auVar9._0_8_);
              dVar7 = std::tanh(dVar7);
              local_1bc[0] = fVar1 * SUB84(dVar7,0);
              break;
            case 6:
              local_1a8 = 0;
              fVar1 = *(float *)*local_1c8;
              local_1bc[1] = 1.4013e-45;
              local_1bc[2] = 0.0;
              fVar6 = -*(float *)(*local_1c8 + 4) / fVar1;
              local_1b0 = local_1c8;
              local_1a0 = local_1c8;
              if (fVar6 <= local_4e0) {
                if (local_4e0 <= 1.0 / fVar1 + fVar6) {
                  local_1bc[0] = local_4e0 * (local_4e0 * fVar1 + *(float *)(*local_1c8 + 4));
                }
              }
              else {
                local_1bc[0] = 0.0;
              }
            }
            local_4e0 = local_1bc[0];
            *(float *)((long)local_478 + (long)local_4dc * 4) = local_1bc[0];
          }
          local_478 = (void *)((long)local_478 + (long)local_4d0 * 4);
        }
      }
    }
    Deconvolution::cut_padding
              (in_stack_fffffffffffff958,
               (Mat *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950),
               in_stack_fffffffffffff948,(Option *)in_stack_fffffffffffff940);
    bVar5 = true;
    if (*local_3d8 != 0) {
      bVar5 = local_3d8[8] * (long)(int)local_3d8[7] == 0;
    }
    if (bVar5) {
      local_3bc = -100;
    }
    else {
      local_3bc = 0;
    }
  }
  else {
    local_3bc = -100;
  }
  puVar12 = (undefined8 *)local_458;
  if ((Allocator *)local_458._8_8_ != (Allocator *)0x0) {
    LOCK();
    iVar10 = *(int *)(_func_int ***)local_458._8_8_;
    *(int *)(_func_int ***)local_458._8_8_ = *(int *)(_func_int ***)local_458._8_8_ + -1;
    UNLOCK();
    if (iVar10 == 1) {
      if (local_438 == (long *)0x0) {
        if ((void *)local_458._0_8_ != (void *)0x0) {
          free((void *)local_458._0_8_);
        }
      }
      else {
        (**(code **)(*local_438 + 0x18))(local_438,local_458._0_8_);
      }
    }
  }
  *puVar12 = 0;
  puVar12[2] = 0;
  *(undefined4 *)(puVar12 + 3) = 0;
  *(undefined4 *)(puVar12 + 5) = 0;
  *(undefined4 *)((long)puVar12 + 0x2c) = 0;
  *(undefined4 *)(puVar12 + 6) = 0;
  *(undefined4 *)((long)puVar12 + 0x34) = 0;
  *(undefined4 *)(puVar12 + 7) = 0;
  puVar12[8] = 0;
  puVar12[1] = 0;
  return local_3bc;
}

Assistant:

int Deconvolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}